

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O2

void __thiscall Args::CmdLine::clear(CmdLine *this)

{
  pointer ppCVar1;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::CmdLine::clear()::_lambda(auto:1_const&)_1_>
            ((this->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_args).
             super__Vector_base<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this->m_command = (Command *)0x0;
  this->m_currCommand = (Command *)0x0;
  ppCVar1 = (this->m_prevCommand).
            super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_prevCommand).super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppCVar1) {
    (this->m_prevCommand).super__Vector_base<Args::Command_*,_std::allocator<Args::Command_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppCVar1;
  }
  return;
}

Assistant:

void clear()
	{
		std::for_each( arguments().begin(), arguments().end(),
			[] ( const auto & a ) { a->clear(); } );

		m_command = nullptr;
		m_currCommand = nullptr;
		m_prevCommand.clear();
	}